

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveComments.cpp
# Opt level: O2

void Assimp::CommentRemover::RemoveMultiLineComments
               (char *szCommentStart,char *szCommentEnd,char *szBuffer,char chReplacement)

{
  char cVar1;
  int iVar2;
  size_t __n;
  size_t __n_00;
  ulong uVar3;
  
  if ((((szCommentStart == (char *)0x0) || (szCommentEnd == (char *)0x0)) ||
      (szBuffer == (char *)0x0)) || ((*szCommentStart == '\0' || (*szCommentEnd == '\0')))) {
    __assert_fail("__null != szCommentStart && __null != szCommentEnd && __null != szBuffer && *szCommentStart && *szCommentEnd"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/RemoveComments.cpp"
                  ,0x57,
                  "static void Assimp::CommentRemover::RemoveMultiLineComments(const char *, const char *, char *, char)"
                 );
  }
  __n = strlen(szCommentEnd);
  __n_00 = strlen(szCommentStart);
LAB_003a4ba0:
  do {
    cVar1 = *szBuffer;
    if ((cVar1 == '\"') || (cVar1 == '\'')) {
      while (szBuffer = szBuffer + 1, cVar1 != '\0') {
        cVar1 = *szBuffer;
        if ((cVar1 == '\'') || (cVar1 == '\"')) break;
      }
    }
    else if (cVar1 == '\0') {
      return;
    }
    iVar2 = strncmp(szBuffer,szCommentStart,__n_00);
    if (iVar2 == 0) {
      while( true ) {
        if (*szBuffer == '\0') goto LAB_003a4ba0;
        iVar2 = strncmp(szBuffer,szCommentEnd,__n);
        if (iVar2 == 0) break;
        *szBuffer = chReplacement;
        szBuffer = szBuffer + 1;
      }
      for (uVar3 = 0; (uVar3 & 0xffffffff) < __n; uVar3 = uVar3 + 1) {
        szBuffer[uVar3] = chReplacement;
      }
      szBuffer = szBuffer + uVar3;
      goto LAB_003a4ba0;
    }
    szBuffer = szBuffer + 1;
  } while( true );
}

Assistant:

void CommentRemover::RemoveMultiLineComments(const char* szCommentStart,
    const char* szCommentEnd,char* szBuffer,
    char chReplacement)
{
    // validate parameters
    ai_assert(NULL != szCommentStart && NULL != szCommentEnd &&
        NULL != szBuffer && *szCommentStart && *szCommentEnd);

    const size_t len  = strlen(szCommentEnd);
    const size_t len2 = strlen(szCommentStart);

    while (*szBuffer)   {
        // skip over quotes
        if (*szBuffer == '\"' || *szBuffer == '\'')
            while (*szBuffer++ && *szBuffer != '\"' && *szBuffer != '\'');

        if (!strncmp(szBuffer,szCommentStart,len2))  {
            while (*szBuffer) {
                if (!::strncmp(szBuffer,szCommentEnd,len)) {
                    for (unsigned int i = 0; i < len;++i)
                        *szBuffer++ = chReplacement;

                    break;
                }
            *szBuffer++ = chReplacement;
            }
            continue;
        }
        ++szBuffer;
    }
}